

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

bool r_exec::e10(Context *context,uint16_t *index)

{
  byte bVar1;
  uint16_t uVar2;
  bool bVar3;
  float __y;
  __type_conflict _Var4;
  Atom local_58 [4];
  undefined4 local_54;
  Atom local_50 [16];
  Context local_40;
  undefined1 local_30 [8];
  Context arg;
  uint16_t *index_local;
  Context *context_local;
  
  arg.implementation = (_Context *)index;
  Context::getChild(&local_40,(uint16_t)context);
  Context::operator*((Context *)local_30);
  Context::~Context(&local_40);
  Context::operator[]((Context *)local_30,0);
  bVar1 = r_code::Atom::isFloat();
  bVar3 = (bVar1 & 1) != 0;
  if (bVar3) {
    Context::operator[]((Context *)local_30,0);
    __y = (float)r_code::Atom::asFloat();
    _Var4 = std::pow<int,float>(10,__y);
    r_code::Atom::Float((float)_Var4);
    uVar2 = Context::setAtomicResult(context,local_50);
    *(uint16_t *)&(arg.implementation)->_vptr__Context = uVar2;
    r_code::Atom::~Atom(local_50);
  }
  else {
    r_code::Atom::Nil();
    uVar2 = Context::setAtomicResult(context,local_58);
    *(uint16_t *)&(arg.implementation)->_vptr__Context = uVar2;
    r_code::Atom::~Atom(local_58);
  }
  local_54 = 1;
  Context::~Context((Context *)local_30);
  return bVar3;
}

Assistant:

bool e10(const Context &context, uint16_t &index)
{
    Context arg = *context.getChild(1);

    if (arg[0].isFloat()) {
        index = context.setAtomicResult(Atom::Float(pow(10, arg[0].asFloat())));
        return true;
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}